

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

GenerateRegionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenerateRegionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SyntaxList<slang::syntax::MemberSyntax> *args_2,Token *args_3)

{
  Token keyword;
  Token endgenerate;
  GenerateRegionSyntax *this_00;
  
  this_00 = (GenerateRegionSyntax *)allocate(this,0xa8,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  endgenerate.kind = args_3->kind;
  endgenerate._2_1_ = args_3->field_0x2;
  endgenerate.numFlags.raw = (args_3->numFlags).raw;
  endgenerate.rawLen = args_3->rawLen;
  endgenerate.info = args_3->info;
  slang::syntax::GenerateRegionSyntax::GenerateRegionSyntax(this_00,args,keyword,args_2,endgenerate)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }